

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void __thiscall kratos::ExtractDebugVisitor::visit(ExtractDebugVisitor *this,ScopedStmtBlock *stmt)

{
  ScopedStmtBlock *stmt_local;
  ExtractDebugVisitor *this_local;
  
  process_stmt(this,(Stmt *)stmt);
  return;
}

Assistant:

void visit(ScopedStmtBlock *stmt) override { process_stmt(stmt); }